

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManCollectLeaves_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,int fFirst)

{
  int *piVar1;
  uint uVar2;
  int Entry;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = fFirst != 0;
  while( true ) {
    if ((!bVar5) && (*(long *)pObj < 0)) {
      Entry = Gia_ObjId(p,pObj);
      uVar4 = 0;
      uVar3 = (ulong)(uint)vLeaves->nSize;
      if (vLeaves->nSize < 1) {
        uVar3 = uVar4;
      }
      do {
        if (uVar3 == uVar4) {
          Vec_IntPush(vLeaves,Entry);
          return;
        }
        piVar1 = vLeaves->pArray + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 != Entry);
      return;
    }
    uVar2 = (uint)*(long *)pObj;
    if (((int)uVar2 < 0) || (uVar2 = uVar2 & 0x1fffffff, uVar2 == 0x1fffffff)) break;
    bVar5 = false;
    Ga2_ManCollectLeaves_rec(p,pObj + -(ulong)uVar2,vLeaves,0);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0xef,"void Ga2_ManCollectLeaves_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
}

Assistant:

void Ga2_ManCollectLeaves_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, int fFirst )
{
    if ( pObj->fPhase && !fFirst )
    {
        Vec_IntPushUnique( vLeaves, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin0(pObj), vLeaves, 0 );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin1(pObj), vLeaves, 0 );
}